

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O2

bool __thiscall Alignment::CalculateMean(Alignment *this)

{
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  double dVar1;
  pointer pMVar2;
  pointer pMVar3;
  double dVar4;
  long lVar5;
  ostream *poVar6;
  pointer pMVar7;
  long lVar8;
  undefined1 auVar9 [16];
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_40;
  
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    this_00 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(this->Mean + lVar8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,&local_40);
    pMVar3 = this->OriginData[lVar8].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar2 = this->OriginData[lVar8].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pMVar7 = pMVar2; pMVar7 != pMVar3; pMVar7 = pMVar7 + 1) {
      dVar1 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
      dVar4 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
      *(double *)this_00 =
           *(double *)this_00 +
           (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
      *(double *)(this_00 + 8) = *(double *)(this_00 + 8) + dVar4;
      *(double *)(this_00 + 0x10) = dVar1 + *(double *)(this_00 + 0x10);
    }
    lVar5 = ((long)pMVar3 - (long)pMVar2) / 0x18;
    auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = 0x45300000;
    local_40._0_8_ =
         (auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=(this_00,(Scalar *)&local_40)
    ;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return true;
}

Assistant:

bool Alignment::CalculateMean()
{
    for(int i = 0; i < 2; ++i)
    {
        this->Mean[i] = Vector3d::Zero();
        try
        {
            for(auto data : this->OriginData[i])
            {
                this->Mean[i][0] += (data[0]);
                this->Mean[i][1] += (data[1]);
                this->Mean[i][2] += (data[2]);
            }
            this->Mean[i] /= this->OriginData[i].size();
            cout << OriginData[i].size() << endl; 
        }
        catch(const std::exception& e)
        {
            std::cout << e.what() << '\n';
            return false;
        }
    }
    return true;
}